

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::ExplosionDescriptor::Decode(ExplosionDescriptor *this,KDataStream *stream)

{
  Descriptor::Decode(&this->super_Descriptor,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16ExplMat);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
  KDataStream::Read<float>(stream,(float *)&this->m_f32ExplForce);
  return;
}

Assistant:

void ExplosionDescriptor::Decode(KDataStream &stream) noexcept(false)
{
	Descriptor::Decode( stream );

    stream >> m_ui16ExplMat
           >> m_ui16Padding
           >> m_f32ExplForce;           
}